

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_madd32_suov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2,
                           target_ulong_conflict r3)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int64_t result;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  target_ulong_conflict r3_local;
  target_ulong_conflict r2_local;
  target_ulong_conflict r1_local;
  CPUTriCoreState *env_local;
  
  uVar2 = extract64((ulong)r1,0,0x20);
  uVar3 = extract64((ulong)r2,0,0x20);
  uVar4 = extract64((ulong)r3,0,0x20);
  uVar1 = suov32_pos(env,uVar3 + uVar2 * uVar4);
  return uVar1;
}

Assistant:

target_ulong helper_madd32_suov(CPUTriCoreState *env, target_ulong r1,
                                target_ulong r2, target_ulong r3)
{
    uint64_t t1 = extract64(r1, 0, 32);
    uint64_t t2 = extract64(r2, 0, 32);
    uint64_t t3 = extract64(r3, 0, 32);
    int64_t result;

    result = t2 + (t1 * t3);
    return suov32_pos(env, result);
}